

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDIOAnalyzerSettings.cpp
# Opt level: O3

void __thiscall MDIOAnalyzerSettings::MDIOAnalyzerSettings(MDIOAnalyzerSettings *this)

{
  Channel *this_00;
  auto_ptr<AnalyzerSettingInterfaceChannel> *paVar1;
  AnalyzerSettingInterfaceChannel *pAVar2;
  ulong uVar3;
  Channel *pCVar4;
  uint uVar5;
  AnalyzerSettingInterfaceChannel *pAVar6;
  
  AnalyzerSettings::AnalyzerSettings(&this->super_AnalyzerSettings);
  *(undefined ***)this = &PTR__MDIOAnalyzerSettings_0010bd68;
  this_00 = &this->mMdioChannel;
  Channel::Channel(this_00,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  uVar3 = 0xffffffffffffffff;
  Channel::Channel(&this->mMdcChannel,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  paVar1 = &this->mMdioChannelInterface;
  (this->mMdioChannelInterface)._M_ptr = (AnalyzerSettingInterfaceChannel *)0x0;
  (this->mMdcChannelInterface)._M_ptr = (AnalyzerSettingInterfaceChannel *)0x0;
  pAVar2 = (AnalyzerSettingInterfaceChannel *)
           AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,uVar3);
  AnalyzerSettingInterfaceChannel::AnalyzerSettingInterfaceChannel(pAVar2);
  pAVar6 = paVar1->_M_ptr;
  if (pAVar6 != pAVar2) {
    if (pAVar6 != (AnalyzerSettingInterfaceChannel *)0x0) {
      (**(code **)(*(long *)pAVar6 + 8))();
    }
    paVar1->_M_ptr = pAVar2;
    pAVar6 = pAVar2;
  }
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)pAVar6,"MDIO");
  pCVar4 = this_00;
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)paVar1->_M_ptr);
  pAVar2 = (AnalyzerSettingInterfaceChannel *)
           AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pCVar4);
  AnalyzerSettingInterfaceChannel::AnalyzerSettingInterfaceChannel(pAVar2);
  pAVar6 = (this->mMdcChannelInterface)._M_ptr;
  if (pAVar6 != pAVar2) {
    if (pAVar6 != (AnalyzerSettingInterfaceChannel *)0x0) {
      (**(code **)(*(long *)pAVar6 + 8))();
    }
    (this->mMdcChannelInterface)._M_ptr = pAVar2;
    pAVar6 = pAVar2;
  }
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)pAVar6,"MDC");
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)(this->mMdcChannelInterface)._M_ptr);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  uVar5 = (uint)this;
  AnalyzerSettings::AddExportOption(uVar5,(char *)0x0);
  AnalyzerSettings::AddExportExtension(uVar5,(char *)0x0,"text");
  AnalyzerSettings::AddExportExtension(uVar5,(char *)0x0,"csv");
  AnalyzerSettings::ClearChannels();
  AnalyzerSettings::AddChannel((Channel *)this,(char *)this_00,true);
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mMdcChannel,true);
  return;
}

Assistant:

MDIOAnalyzerSettings::MDIOAnalyzerSettings() : mMdioChannel( UNDEFINED_CHANNEL ), mMdcChannel( UNDEFINED_CHANNEL )
{
    mMdioChannelInterface.reset( new AnalyzerSettingInterfaceChannel() );
    mMdioChannelInterface->SetTitleAndTooltip( "MDIO", "MDIO data bus" );
    mMdioChannelInterface->SetChannel( mMdioChannel );

    mMdcChannelInterface.reset( new AnalyzerSettingInterfaceChannel() );
    mMdcChannelInterface->SetTitleAndTooltip( "MDC", "MDIO clock line " );
    mMdcChannelInterface->SetChannel( mMdcChannel );

    AddInterface( mMdioChannelInterface.get() );
    AddInterface( mMdcChannelInterface.get() );

    AddExportOption( 0, "Export as text/csv file" );
    AddExportExtension( 0, "text", "txt" );
    AddExportExtension( 0, "csv", "csv" );

    ClearChannels();
    AddChannel( mMdioChannel, "MDIO", false );
    AddChannel( mMdcChannel, "MDC", false );
}